

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void fl_set_spot(int font,int size,int X,int Y,int W,int H,Fl_Window *win)

{
  bool local_51;
  char *pcStack_50;
  bool must_free_fnt;
  char *fnt;
  char *def_string;
  undefined1 local_38 [4];
  int missing_count;
  char **missing_list;
  XVaNestedList preedit_attr;
  int local_20;
  int change;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  int size_local;
  int font_local;
  
  preedit_attr._4_4_ = 0;
  pcStack_50 = (char *)0x0;
  local_51 = true;
  if ((fl_xim_ic != (XIC)0x0) && (fl_is_over_the_spot != '\0')) {
    if ((X != spot.x) || (Y != spot.y)) {
      spot.x = (short)X;
      spot.y = (short)Y;
      spot.height = (unsigned_short)H;
      spot.width = (unsigned_short)W;
      preedit_attr._4_4_ = 1;
    }
    local_20 = H;
    change = W;
    H_local = Y;
    W_local = X;
    Y_local = size;
    X_local = font;
    if ((font != spotf) || (size != spots)) {
      preedit_attr._4_4_ = 1;
      spotf = font;
      spots = size;
      if (fl_set_spot::fs != (XFontSet)0x0) {
        XFreeFontSet(fl_display,fl_set_spot::fs);
      }
      pcStack_50 = fl_get_font_xfld(X_local,Y_local);
      local_51 = pcStack_50 == (char *)0x0;
      if (local_51) {
        pcStack_50 = "-misc-fixed-*";
      }
      local_51 = !local_51;
      fl_set_spot::fs =
           (XFontSet)XCreateFontSet(fl_display,pcStack_50,local_38,(long)&def_string + 4,&fnt);
    }
    if (fl_xim_ic != fl_set_spot::ic) {
      fl_set_spot::ic = fl_xim_ic;
      preedit_attr._4_4_ = 1;
    }
    if ((pcStack_50 != (char *)0x0) && (local_51)) {
      free(pcStack_50);
    }
    if (preedit_attr._4_4_ != 0) {
      missing_list = (char **)XVaCreateNestedList(0,"spotLocation",&spot,"fontSet",fl_set_spot::fs,0
                                                 );
      XSetICValues(fl_xim_ic,"preeditAttributes",missing_list,0);
      XFree(missing_list);
    }
  }
  return;
}

Assistant:

void fl_set_spot(int font, int size, int X, int Y, int W, int H, Fl_Window *win)
{
  int change = 0;
  XVaNestedList preedit_attr;
  static XFontSet fs = NULL;
  char **missing_list;
  int missing_count;
  char *def_string;
  char *fnt = NULL;
  bool must_free_fnt =true;

  static XIC ic = NULL;

  if (!fl_xim_ic || !fl_is_over_the_spot) return;
  //XSetICFocus(fl_xim_ic);
  if (X != spot.x || Y != spot.y) {
    spot.x = X;
    spot.y = Y;
    spot.height = H;
    spot.width = W;
    change = 1;
  }
  if (font != spotf || size != spots) {
    spotf = font;
    spots = size;
    change = 1;
    if (fs) {
      XFreeFontSet(fl_display, fs);
    }
#if USE_XFT

#if defined(__GNUC__)
// FIXME: warning XFT support here
#endif /*__GNUC__*/

    fnt = NULL; // fl_get_font_xfld(font, size);
    if (!fnt) {fnt = (char*)"-misc-fixed-*";must_free_fnt=false;}
    fs = XCreateFontSet(fl_display, fnt, &missing_list,
                        &missing_count, &def_string);
#else
    fnt = fl_get_font_xfld(font, size);
    if (!fnt) {fnt = (char*)"-misc-fixed-*";must_free_fnt=false;}
    fs = XCreateFontSet(fl_display, fnt, &missing_list,
                        &missing_count, &def_string);
#endif
  }
  if (fl_xim_ic != ic) {
    ic = fl_xim_ic;
    change = 1;
  }

  if (fnt && must_free_fnt) free(fnt);
  if (!change) return;


  preedit_attr = XVaCreateNestedList(0,
                                     XNSpotLocation, &spot,
                                     XNFontSet, fs, NULL);
  XSetICValues(fl_xim_ic, XNPreeditAttributes, preedit_attr, NULL);
  XFree(preedit_attr);
}